

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

JsonParse * jsonParseCached(sqlite3_context *pCtx,sqlite3_value **argv,sqlite3_context *pErrCtx)

{
  int iVar1;
  int iVar2;
  void *__s2;
  JsonParse *pJVar3;
  JsonParse *pJVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  __s2 = sqlite3ValueText(*argv,'\x01');
  iVar1 = sqlite3ValueBytes(*argv,'\x01');
  uVar7 = 0;
  if (__s2 != (void *)0x0) {
    uVar6 = 0xffffffff;
    iVar5 = 0;
    pJVar4 = (JsonParse *)0x0;
    iVar2 = 0;
    do {
      pJVar3 = (JsonParse *)sqlite3_get_auxdata(pCtx,iVar5 + -0x68f72);
      iVar8 = iVar5;
      if (pJVar3 == (JsonParse *)0x0) break;
      iVar8 = iVar2;
      if (((pJVar4 == (JsonParse *)0x0) && (pJVar3->nJson == iVar1)) &&
         (iVar2 = bcmp(pJVar3->zJson,__s2,(long)iVar1), iVar2 == 0)) {
        pJVar3->nErr = '\0';
        pJVar4 = pJVar3;
      }
      else if (pJVar3->iHold < uVar6) {
        uVar6 = pJVar3->iHold;
        iVar8 = iVar5;
      }
      if (uVar7 < pJVar3->iHold) {
        uVar7 = pJVar3->iHold;
      }
      iVar5 = iVar5 + 1;
      iVar2 = iVar8;
    } while (iVar5 != 4);
    if (pJVar4 != (JsonParse *)0x0) {
      pJVar4->nErr = '\0';
      pJVar4->iHold = uVar7 + 1;
      return pJVar4;
    }
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      pJVar4 = (JsonParse *)sqlite3Malloc((long)iVar1 + 0x31);
    }
    else {
      pJVar4 = (JsonParse *)0x0;
    }
    if (pJVar4 == (JsonParse *)0x0) {
      sqlite3_result_error_nomem(pCtx);
    }
    else {
      pJVar4->zJson = (char *)0x0;
      pJVar4->aUp = (u32 *)0x0;
      pJVar4->oom = '\0';
      pJVar4->nErr = '\0';
      pJVar4->iDepth = 0;
      pJVar4->nJson = 0;
      *(undefined8 *)&pJVar4->iHold = 0;
      pJVar4->nNode = 0;
      pJVar4->nAlloc = 0;
      pJVar4->aNode = (JsonNode *)0x0;
      pJVar3 = pJVar4 + 1;
      pJVar4->zJson = (char *)pJVar3;
      memcpy(pJVar3,__s2,(long)(iVar1 + 1));
      iVar2 = jsonParse(pJVar4,pErrCtx,(char *)pJVar3);
      if (iVar2 == 0) {
        pJVar4->nJson = iVar1;
        pJVar4->iHold = uVar7 + 1;
        sqlite3_set_auxdata(pCtx,iVar8 + -0x68f72,pJVar4,jsonParseFree);
        pJVar4 = (JsonParse *)sqlite3_get_auxdata(pCtx,iVar8 + -0x68f72);
        return pJVar4;
      }
      sqlite3_free(pJVar4);
    }
  }
  return (JsonParse *)0x0;
}

Assistant:

static JsonParse *jsonParseCached(
  sqlite3_context *pCtx,
  sqlite3_value **argv,
  sqlite3_context *pErrCtx
){
  const char *zJson = (const char*)sqlite3_value_text(argv[0]);
  int nJson = sqlite3_value_bytes(argv[0]);
  JsonParse *p;
  JsonParse *pMatch = 0;
  int iKey;
  int iMinKey = 0;
  u32 iMinHold = 0xffffffff;
  u32 iMaxHold = 0;
  if( zJson==0 ) return 0;
  for(iKey=0; iKey<JSON_CACHE_SZ; iKey++){
    p = (JsonParse*)sqlite3_get_auxdata(pCtx, JSON_CACHE_ID+iKey);
    if( p==0 ){
      iMinKey = iKey;
      break;
    }
    if( pMatch==0
     && p->nJson==nJson
     && memcmp(p->zJson,zJson,nJson)==0
    ){
      p->nErr = 0;
      pMatch = p;
    }else if( p->iHold<iMinHold ){
      iMinHold = p->iHold;
      iMinKey = iKey;
    }
    if( p->iHold>iMaxHold ){
      iMaxHold = p->iHold;
    }
  }
  if( pMatch ){
    pMatch->nErr = 0;
    pMatch->iHold = iMaxHold+1;
    return pMatch;
  }
  p = sqlite3_malloc64( sizeof(*p) + nJson + 1 );
  if( p==0 ){
    sqlite3_result_error_nomem(pCtx);
    return 0;
  }
  memset(p, 0, sizeof(*p));
  p->zJson = (char*)&p[1];
  memcpy((char*)p->zJson, zJson, nJson+1);
  if( jsonParse(p, pErrCtx, p->zJson) ){
    sqlite3_free(p);
    return 0;
  }
  p->nJson = nJson;
  p->iHold = iMaxHold+1;
  sqlite3_set_auxdata(pCtx, JSON_CACHE_ID+iMinKey, p,
                      (void(*)(void*))jsonParseFree);
  return (JsonParse*)sqlite3_get_auxdata(pCtx, JSON_CACHE_ID+iMinKey);
}